

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O0

void worker(void *arg)

{
  void *arg_local;
  
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                 ,0x2a,sc,"ABC");
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                 ,0x30,sc,"ABC");
  return;
}

Assistant:

void worker (NN_UNUSED void *arg)
{
    /*  Wait 0.1 sec for the main thread to block. */
    nn_sleep (100);

    test_send (sc, "ABC");

    /*  Wait 0.1 sec for the main thread to process the previous message
        and block once again. */
    nn_sleep (100);

    test_send (sc, "ABC");
}